

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O1

void __thiscall
interfaces_tests::findFirstBlockWithTimeAndHeight::test_method
          (findFirstBlockWithTimeAndHeight *this)

{
  long lVar1;
  Chain *pCVar2;
  uint256 *puVar3;
  uchar *puVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  int iVar13;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar14;
  Chainstate *pCVar15;
  char *pcVar16;
  iterator pvVar17;
  iterator in_R9;
  iterator pvVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar21;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  assertion_result local_1a8;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  int height;
  char **local_130;
  int *local_128;
  char *local_120;
  assertion_result local_118;
  uint256 *local_100;
  lazy_ostream local_f8;
  undefined1 *local_e8;
  assertion_result *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  unkbyte9 local_a8;
  undefined7 uStack_9f;
  unkbyte9 local_98;
  undefined7 uStack_8f;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  assertion_result local_78;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  uchar uStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  uchar uStack_59;
  uint256 hash;
  
  local_78.m_message.pn.pi_ = (sp_counted_base *)local_78.m_message.px;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar14 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar14,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x41,"test_method","m_node.chainman");
  criticalblock13.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock13.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock13.super_unique_lock);
  pcVar16 = "m_node.chainman";
  puVar14 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (puVar14,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                       ,0x43,"test_method","m_node.chainman");
  pCVar15 = ChainstateManager::ActiveChainstate
                      ((puVar14->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x46;
  file.m_begin = (iterator)&local_148;
  msg.m_end = in_R9;
  msg.m_begin = pcVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_98 = SUB169((undefined1  [16])0x0,0);
  uStack_8f = 0;
  local_a8 = SUB169((undefined1  [16])0x0,0);
  uStack_9f = 0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_d8._8_8_ = &height;
  local_d8._0_8_ = &hash;
  _cVar21 = 0x400d01;
  iVar13 = (*pCVar2->_vptr_Chain[0xb])(pCVar2,0,5,local_d8);
  local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)SUB41(iVar13,0);
  local_1a8.m_message.px = (element_type *)0x0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78._0_8_ =
       "chain->findFirstBlockWithTimeAndHeight( 0, 5, FoundBlock().hash(hash).height(height))";
  local_78.m_message.px = (element_type *)0xec44d6;
  local_f8.m_empty = false;
  local_f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_160 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  local_e0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,&local_f8,1,0,WARN,_cVar21,(size_t)&local_168,0x46);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x47;
  file_00.m_begin = (iterator)&local_178;
  msg_00.m_end = pvVar18;
  msg_00.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
             msg_00);
  local_1a8.m_message.px = (element_type *)(local_1a8.m_message._1_8_ << 8);
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  puVar3 = (pCVar15->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_start[5]->phashBlock;
  if (puVar3 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  local_78._0_8_ = *(undefined8 *)&puVar3->super_base_blob<256U>;
  puVar4 = (puVar3->super_base_blob<256U>).m_data._M_elems + 8;
  uVar5 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x10];
  uVar6 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x11];
  uVar7 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x12];
  uVar8 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x13];
  uVar9 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x14];
  uVar10 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x15];
  uVar11 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x16];
  uVar12 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x17];
  uStack_60 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x18];
  uStack_5f = (puVar3->super_base_blob<256U>).m_data._M_elems[0x19];
  uStack_5e = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1a];
  uStack_5d = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1b];
  uStack_5c = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1c];
  uStack_5b = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1d];
  uStack_5a = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1e];
  uStack_59 = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1f];
  local_78.m_message.pn.pi_._0_1_ = uVar5;
  local_78.m_message.pn.pi_._1_1_ = uVar6;
  local_78.m_message.pn.pi_._2_1_ = uVar7;
  local_78.m_message.pn.pi_._3_1_ = uVar8;
  local_78.m_message.pn.pi_._4_1_ = uVar9;
  local_78.m_message.pn.pi_._5_1_ = uVar10;
  local_78.m_message.pn.pi_._6_1_ = uVar11;
  local_78.m_message.pn.pi_._7_1_ = uVar12;
  local_78.m_message.px = *(element_type **)puVar4;
  auVar20[0] = -(uVar5 == hash.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar20[1] = -(uVar6 == hash.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar20[2] = -(uVar7 == hash.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar20[3] = -(uVar8 == hash.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar20[4] = -(uVar9 == hash.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar20[5] = -(uVar10 == hash.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar20[6] = -(uVar11 == hash.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar20[7] = -(uVar12 == hash.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar20[8] = -(uStack_60 == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar20[9] = -(uStack_5f == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar20[10] = -(uStack_5e == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar20[0xb] = -(uStack_5d == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar20[0xc] = -(uStack_5c == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar20[0xd] = -(uStack_5b == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar20[0xe] = -(uStack_5a == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar20[0xf] = -(uStack_59 == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar19[0] = -(*(uchar *)&puVar3->super_base_blob<256U> ==
                hash.super_base_blob<256U>.m_data._M_elems[0]);
  auVar19[1] = -((puVar3->super_base_blob<256U>).m_data._M_elems[1] ==
                hash.super_base_blob<256U>.m_data._M_elems[1]);
  auVar19[2] = -((puVar3->super_base_blob<256U>).m_data._M_elems[2] ==
                hash.super_base_blob<256U>.m_data._M_elems[2]);
  auVar19[3] = -((puVar3->super_base_blob<256U>).m_data._M_elems[3] ==
                hash.super_base_blob<256U>.m_data._M_elems[3]);
  auVar19[4] = -((puVar3->super_base_blob<256U>).m_data._M_elems[4] ==
                hash.super_base_blob<256U>.m_data._M_elems[4]);
  auVar19[5] = -((puVar3->super_base_blob<256U>).m_data._M_elems[5] ==
                hash.super_base_blob<256U>.m_data._M_elems[5]);
  auVar19[6] = -((puVar3->super_base_blob<256U>).m_data._M_elems[6] ==
                hash.super_base_blob<256U>.m_data._M_elems[6]);
  auVar19[7] = -((puVar3->super_base_blob<256U>).m_data._M_elems[7] ==
                hash.super_base_blob<256U>.m_data._M_elems[7]);
  auVar19[8] = -(*puVar4 == hash.super_base_blob<256U>.m_data._M_elems[8]);
  auVar19[9] = -((puVar3->super_base_blob<256U>).m_data._M_elems[9] ==
                hash.super_base_blob<256U>.m_data._M_elems[9]);
  auVar19[10] = -((puVar3->super_base_blob<256U>).m_data._M_elems[10] ==
                 hash.super_base_blob<256U>.m_data._M_elems[10]);
  auVar19[0xb] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xb] ==
                  hash.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar19[0xc] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xc] ==
                  hash.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar19[0xd] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xd] ==
                  hash.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar19[0xe] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xe] ==
                  hash.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar19[0xf] = -((puVar3->super_base_blob<256U>).m_data._M_elems[0xf] ==
                  hash.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar19 = auVar19 & auVar20;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128 = (int *)0xec3fe7;
  local_120 = "";
  local_c8._8_8_ = &local_100;
  local_d8[8] = 0;
  local_d8._0_8_ = &PTR__lazy_ostream_013d4988;
  local_c8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_f8.m_empty = false;
  local_f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d4988;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x2;
  local_130 = (char **)&local_78;
  local_100 = &hash;
  local_e0 = (assertion_result *)&local_130;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&local_1a8,1,2,REQUIRE,0xfe8e3e,(size_t)&local_128,0x47,
             local_d8,"active[5]->GetBlockHash()",&local_f8);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x48;
  file_01.m_begin = (iterator)&local_1b8;
  msg_01.m_end = pvVar18;
  msg_01.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c8,
             msg_01);
  local_1a8.m_message.px = (element_type *)(local_1a8.m_message._1_8_ << 8);
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_130 = (char **)CONCAT44(local_130._4_4_,5);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(height == 5);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_118.m_message.px = (element_type *)0xec4049;
  local_128 = &height;
  local_d8[8] = 0;
  local_d8._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_c8._8_8_ = &local_128;
  local_c8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_f8.m_empty = false;
  local_f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3e70;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (assertion_result *)&local_100;
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x2;
  local_100 = (uint256 *)&local_130;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,(lazy_ostream *)&local_1a8,1,2,REQUIRE,0xff05ac,(size_t)&local_118,0x48,
             local_d8,"5",&local_f8);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x49;
  file_02.m_begin = (iterator)&local_1d8;
  msg_02.m_end = pvVar18;
  msg_02.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e8,
             msg_02);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_98 = SUB169((undefined1  [16])0x0,7);
  local_a8 = SUB169((undefined1  [16])0x0,0);
  uStack_9f = 0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  _cVar21 = 0x4010ee;
  iVar13 = (*pCVar2->_vptr_Chain[0xb])
                     (pCVar2,(ulong)(pCVar15->m_chain).vChain.
                                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish[-1]->nTimeMax + 1,0);
  local_1a8._0_8_ = CONCAT71(local_1a8._1_7_,(char)iVar13) ^ 1;
  local_1a8.m_message.px = (element_type *)0x0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78._0_8_ =
       "!chain->findFirstBlockWithTimeAndHeight( active.Tip()->GetBlockTimeMax() + 1, 0)";
  local_78.m_message.px = (element_type *)0xec4541;
  local_f8.m_empty = false;
  local_f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_1f0 = "";
  local_e0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,&local_f8,1,0,WARN,_cVar21,(size_t)&local_1f8,0x49);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findFirstBlockWithTimeAndHeight)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();
    uint256 hash;
    int height;
    BOOST_CHECK(chain->findFirstBlockWithTimeAndHeight(/* min_time= */ 0, /* min_height= */ 5, FoundBlock().hash(hash).height(height)));
    BOOST_CHECK_EQUAL(hash, active[5]->GetBlockHash());
    BOOST_CHECK_EQUAL(height, 5);
    BOOST_CHECK(!chain->findFirstBlockWithTimeAndHeight(/* min_time= */ active.Tip()->GetBlockTimeMax() + 1, /* min_height= */ 0));
}